

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

DispatchCallResult __thiscall
capnp::_::anon_unknown_0::TestNoTailForwarder::dispatchCall
          (TestNoTailForwarder *this,uint64_t interfaceId,uint16_t methodId,
          CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  long lVar1;
  PromiseArena *pPVar2;
  PointerReader other;
  void *pvVar3;
  size_t __n;
  undefined6 in_register_00000012;
  void *__buf;
  undefined8 extraout_RDX;
  int __flags;
  undefined8 *in_R8;
  PromiseBase location;
  DispatchCallResult DVar5;
  MessageSizeCounts MVar6;
  anon_class_8_1_bc11688f_for_func local_e8;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_e0;
  void *continuationTracePtr;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:2122:36),_capnp::Response<capnp::AnyPointer>_>
  promise;
  RemotePromise<capnp::AnyPointer> local_c8;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_98;
  Request<capnp::AnyPointer,_capnp::AnyPointer> req;
  Maybe<capnp::MessageSize> local_68;
  Reader params;
  undefined8 uVar4;
  Maybe<capnp::MessageSize> *sizeHint;
  
  if ((int)context.hook == 3 && CONCAT62(in_register_00000012,methodId) == 0xddc70bf9784133cf) {
    DVar5 = capnproto_test::capnp::test::TestMoreStuff::Server::dispatchCall
                      (&this->super_Server,interfaceId,0x33cf,
                       (CallContext<capnp::AnyPointer,_capnp::AnyPointer>)0x3);
    uVar4 = DVar5._8_8_;
  }
  else {
    (**(code **)*in_R8)(&params.reader);
    lVar1 = *(long *)(*(long *)(interfaceId + 8) + -0x18);
    MVar6 = PointerReader::targetSize(&params.reader);
    local_68.ptr.field_1.value.wordCount = MVar6.wordCount;
    sizeHint = &local_68;
    local_68.ptr.isSet = true;
    local_68.ptr.field_1.value.capCount = MVar6.capCount;
    __n = (ulong)context.hook & 0xffff;
    Capability::Client::typelessRequest
              (&req,(Client *)(interfaceId + 8 + lVar1),CONCAT62(in_register_00000012,methodId),
               (uint16_t)context.hook,sizeHint,(CallHints)0x0);
    __flags = (int)sizeHint;
    other.capTable = params.reader.capTable;
    other.segment = params.reader.segment;
    other.pointer = params.reader.pointer;
    other.nestingLimit = params.reader.nestingLimit;
    other._28_4_ = params.reader._28_4_;
    PointerBuilder::copyFrom((PointerBuilder *)&req,other,false);
    Request<capnp::AnyPointer,_capnp::AnyPointer>::send
              ((Request<capnp::AnyPointer,_capnp::AnyPointer> *)&local_c8,(int)&req,__buf,__n,
               __flags);
    continuationTracePtr =
         kj::_::
         SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:2122:36)>
         ::anon_class_8_1_bc11688f_for_func::operator();
    pPVar2 = ((PromiseArenaMember *)
             local_c8.super_Promise<capnp::Response<capnp::AnyPointer>_>.super_PromiseBase.node.ptr)
             ->arena;
    if (pPVar2 == (PromiseArena *)0x0 ||
        (ulong)((long)local_c8.super_Promise<capnp::Response<capnp::AnyPointer>_>.super_PromiseBase.
                      node.ptr - (long)pPVar2) < 0x28) {
      pvVar3 = operator_new(0x400);
      location.node.ptr = (OwnPromiseNode)((long)pvVar3 + 0x3d8);
      kj::
      ctor<kj::_::SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,capnp::_::(anonymous_namespace)::TestNoTailForwarder::dispatchCall(unsigned_long,unsigned_short,capnp::CallContext<capnp::AnyPointer,capnp::AnyPointer>)::_lambda(capnp::Response<capnp::AnyPointer>)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::_::(anonymous_namespace)::TestNoTailForwarder::dispatchCall(unsigned_long,unsigned_short,capnp::CallContext<capnp::AnyPointer,capnp::AnyPointer>)::_lambda(capnp::Response<capnp::AnyPointer>)_1_,void*&>
                ((SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:2122:36)>
                  *)location.node.ptr,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_c8,
                 &local_e8,&continuationTracePtr);
      *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
    }
    else {
      ((PromiseArenaMember *)
      local_c8.super_Promise<capnp::Response<capnp::AnyPointer>_>.super_PromiseBase.node.ptr)->arena
           = (PromiseArena *)0x0;
      location.node.ptr =
           (OwnPromiseNode)
           &(((PromiseNode *)
             ((long)local_c8.super_Promise<capnp::Response<capnp::AnyPointer>_>.super_PromiseBase.
                    node.ptr + -0x30))->super_PromiseArenaMember).arena;
      kj::
      ctor<kj::_::SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,capnp::_::(anonymous_namespace)::TestNoTailForwarder::dispatchCall(unsigned_long,unsigned_short,capnp::CallContext<capnp::AnyPointer,capnp::AnyPointer>)::_lambda(capnp::Response<capnp::AnyPointer>)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::_::(anonymous_namespace)::TestNoTailForwarder::dispatchCall(unsigned_long,unsigned_short,capnp::CallContext<capnp::AnyPointer,capnp::AnyPointer>)::_lambda(capnp::Response<capnp::AnyPointer>)_1_,void*&>
                ((SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:2122:36)>
                  *)location.node.ptr,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_c8,
                 &local_e8,&continuationTracePtr);
      (((PromiseNode *)
       ((long)local_c8.super_Promise<capnp::Response<capnp::AnyPointer>_>.super_PromiseBase.node.ptr
       + -0x20))->super_PromiseArenaMember)._vptr_PromiseArenaMember = (_func_int **)pPVar2;
    }
    local_e0.ptr = (PromiseNode *)0x0;
    local_98.ptr = (PromiseNode *)0x0;
    promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)location.node.ptr;
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_98);
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_e0);
    RemotePromise<capnp::AnyPointer>::~RemotePromise(&local_c8);
    promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
    *(OwnPromiseNode *)&this->super_Server = location.node.ptr;
    *(undefined2 *)&(this->super_Server).field_0x8 = 0;
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
    kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose(&req.hook);
    uVar4 = extraout_RDX;
  }
  DVar5.isStreaming = (bool)(char)uVar4;
  DVar5.allowCancellation = (bool)(char)((ulong)uVar4 >> 8);
  DVar5._10_6_ = (int6)((ulong)uVar4 >> 0x10);
  DVar5.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar5;
}

Assistant:

DispatchCallResult dispatchCall(uint64_t interfaceId, uint16_t methodId,
                                  CallContext<AnyPointer, AnyPointer> context) override {
    if (interfaceId == capnp::typeId<test::TestMoreStuff>() && methodId == 3) {
      // Calling TestMoreStuff.hold(). Dispatch normally.
      return test::TestMoreStuff::Server::dispatchCall(interfaceId, methodId, context);
    }

    auto params = context.getParams();
    auto req = next.typelessRequest(interfaceId, methodId, params.targetSize(), {});
    req.set(params);
    auto promise = req.send().then([context](Response<AnyPointer> resp) mutable {
      context.getResults(resp.targetSize()).set(resp);
    });
    return { .promise = kj::mv(promise), .isStreaming = false };
  }